

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O0

void __thiscall
DScroller::DScroller
          (DScroller *this,EScroll type,double dx,double dy,int control,int affectee,int accel,
          EScrollPos scrollpos)

{
  EScrollPos EVar1;
  DInterpolation *pDVar2;
  double dVar3;
  double dVar4;
  DScroller *local_50;
  EScrollPos scrollpos_local;
  int accel_local;
  int affectee_local;
  int control_local;
  double dy_local;
  double dx_local;
  EScroll type_local;
  DScroller *this_local;
  
  DThinker::DThinker(&this->super_DThinker,0x20);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_009faa10;
  local_50 = (DScroller *)this->m_Interpolations;
  do {
    TObjPtr<DInterpolation>::TObjPtr((TObjPtr<DInterpolation> *)local_50);
    local_50 = (DScroller *)
               ((anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1 *)&local_50->super_DThinker +
               1);
  } while (local_50 != this + 1);
  this->m_Type = type;
  this->m_dx = dx;
  this->m_dy = dy;
  this->m_Accel = accel;
  this->m_Parts = scrollpos;
  this->m_vdy = 0.0;
  this->m_vdx = 0.0;
  this->m_LastHeight = 0.0;
  this->m_Control = control;
  if (control != -1) {
    dVar3 = sector_t::CenterFloor((sector_t *)(sectors + control));
    dVar4 = sector_t::CenterCeiling((sector_t *)(sectors + control));
    this->m_LastHeight = dVar3 + dVar4;
  }
  this->m_Affectee = affectee;
  pDVar2 = TObjPtr<DInterpolation>::operator=(this->m_Interpolations + 2,(DInterpolation *)0x0);
  pDVar2 = TObjPtr<DInterpolation>::operator=(this->m_Interpolations + 1,pDVar2);
  TObjPtr<DInterpolation>::operator=(this->m_Interpolations,pDVar2);
  switch(type) {
  case sc_side:
    sides[affectee].Flags = sides[affectee].Flags | 2;
    EVar1 = ::operator&(this->m_Parts,scw_top);
    if (EVar1 != 0) {
      pDVar2 = side_t::SetInterpolation(sides + this->m_Affectee,0);
      TObjPtr<DInterpolation>::operator=(this->m_Interpolations,pDVar2);
    }
    EVar1 = ::operator&(this->m_Parts,scw_mid);
    if ((EVar1 != 0) &&
       (((sides[this->m_Affectee].linedef)->backsector == (sector_t_conflict *)0x0 ||
        (((sides[this->m_Affectee].linedef)->flags & 0x200000) == 0)))) {
      pDVar2 = side_t::SetInterpolation(sides + this->m_Affectee,1);
      TObjPtr<DInterpolation>::operator=(this->m_Interpolations + 1,pDVar2);
    }
    EVar1 = ::operator&(this->m_Parts,scw_bottom);
    if (EVar1 != 0) {
      pDVar2 = side_t::SetInterpolation(sides + this->m_Affectee,2);
      TObjPtr<DInterpolation>::operator=(this->m_Interpolations + 2,pDVar2);
    }
    break;
  case sc_floor:
    pDVar2 = sector_t::SetInterpolation((sector_t *)(sectors + affectee),3,false);
    TObjPtr<DInterpolation>::operator=(this->m_Interpolations,pDVar2);
    break;
  case sc_ceiling:
    pDVar2 = sector_t::SetInterpolation((sector_t *)(sectors + affectee),2,false);
    TObjPtr<DInterpolation>::operator=(this->m_Interpolations,pDVar2);
    break;
  case sc_carry:
    FLevelLocals::AddScroller(&::level,affectee);
  }
  return;
}

Assistant:

DScroller::DScroller (EScroll type, double dx, double dy,
					  int control, int affectee, int accel, EScrollPos scrollpos)
	: DThinker (STAT_SCROLLER)
{
	m_Type = type;
	m_dx = dx;
	m_dy = dy;
	m_Accel = accel;
	m_Parts = scrollpos;
	m_vdx = m_vdy = 0;
	m_LastHeight = 0;
	if ((m_Control = control) != -1)
		m_LastHeight =
			sectors[control].CenterFloor () + sectors[control].CenterCeiling ();
	m_Affectee = affectee;
	m_Interpolations[0] = m_Interpolations[1] = m_Interpolations[2] = NULL;

	switch (type)
	{
	case EScroll::sc_carry:
		level.AddScroller (affectee);
		break;

	case EScroll::sc_side:
		sides[affectee].Flags |= WALLF_NOAUTODECALS;
		if (m_Parts & EScrollPos::scw_top)
		{
			m_Interpolations[0] = sides[m_Affectee].SetInterpolation(side_t::top);
		}
		if (m_Parts & EScrollPos::scw_mid && (sides[m_Affectee].linedef->backsector == NULL ||
			!(sides[m_Affectee].linedef->flags&ML_3DMIDTEX)))
		{
			m_Interpolations[1] = sides[m_Affectee].SetInterpolation(side_t::mid);
		}
		if (m_Parts & EScrollPos::scw_bottom)
		{
			m_Interpolations[2] = sides[m_Affectee].SetInterpolation(side_t::bottom);
		}
		break;

	case EScroll::sc_floor:
		m_Interpolations[0] = sectors[affectee].SetInterpolation(sector_t::FloorScroll, false);
		break;

	case EScroll::sc_ceiling:
		m_Interpolations[0] = sectors[affectee].SetInterpolation(sector_t::CeilingScroll, false);
		break;

	default:
		break;
	}
}